

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O2

DWARFDie __thiscall llvm::DWARFUnit::getPreviousSibling(DWARFUnit *this,DWARFDebugInfoEntry *Die)

{
  uint32_t uVar1;
  pointer pDVar2;
  long lVar3;
  uint32_t uVar4;
  DWARFDebugInfoEntry *pDVar5;
  long lVar6;
  DWARFDie DVar7;
  
  if ((Die == (DWARFDebugInfoEntry *)0x0) || (uVar1 = Die->Depth, uVar1 == 0)) {
    this = (DWARFUnit *)0x0;
    pDVar5 = (DWARFDebugInfoEntry *)0x0;
  }
  else {
    uVar4 = getDIEIndex(this,Die);
    pDVar2 = (this->DieArray).
             super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pDVar5 = (DWARFDebugInfoEntry *)0x0;
    lVar3 = (ulong)uVar4 * 0x18;
    do {
      lVar6 = lVar3;
      if ((lVar6 + -0x18 == -0x18) ||
         (uVar4 = *(uint32_t *)((long)pDVar2 + lVar6 + -0x10), uVar4 == uVar1 - 1)) {
        this = (DWARFUnit *)0x0;
        goto LAB_00b46e64;
      }
      lVar3 = lVar6 + -0x18;
    } while (uVar4 != uVar1);
    pDVar5 = (DWARFDebugInfoEntry *)((long)&pDVar2[-1].Offset + lVar6);
  }
LAB_00b46e64:
  DVar7.Die = pDVar5;
  DVar7.U = this;
  return DVar7;
}

Assistant:

DWARFDie DWARFUnit::getPreviousSibling(const DWARFDebugInfoEntry *Die) {
  if (!Die)
    return DWARFDie();
  uint32_t Depth = Die->getDepth();
  // Unit DIEs always have a depth of zero and never have siblings.
  if (Depth == 0)
    return DWARFDie();

  // Find the previous DIE whose depth is the same as the Die's depth.
  for (size_t I = getDIEIndex(Die); I > 0;) {
    --I;
    if (DieArray[I].getDepth() == Depth - 1)
      return DWARFDie();
    if (DieArray[I].getDepth() == Depth)
      return DWARFDie(this, &DieArray[I]);
  }
  return DWARFDie();
}